

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall mocker::ir::Builder::operator()(Builder *this,IdentifierExpr *node)

{
  BuilderContext *pBVar1;
  element_type *peVar2;
  pointer pcVar3;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __node_base *local_40 [2];
  __node_base local_30 [2];
  
  pBVar1 = this->ctx;
  local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_60,(string *)pBVar1);
  if (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_70) {
    operator_delete(local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_70._0_8_ + 1);
  }
  pBVar1 = this->ctx;
  local_60._16_8_ = local_60._0_8_;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_60._8_8_ + 8) = *(int *)(local_60._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_60._8_8_ + 8) = *(int *)(local_60._8_8_ + 8) + 1;
    }
  }
  BuilderContext::setExprAddr(pBVar1,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)(local_60 + 0x10))
  ;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  pBVar1 = this->ctx;
  peVar2 = (node->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->val)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar3,pcVar3 + (peVar2->val)._M_string_length);
  makeReg((Builder *)&local_80,(string *)this);
  BuilderContext::
  emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
            (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_60,&local_80);
  if (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],(ulong)((long)&(local_30[0]._M_nxt)->_M_nxt + 1));
  }
  local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_emplace<unsigned_long>(&(this->ctx->trivialExpr)._M_h);
  BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::IdentifierExpr &node) const {
  auto dest = ctx.makeTempLocalReg();
  ctx.setExprAddr(node.getID(), dest);
  ctx.emplaceInst<Load>(dest, makeReg(node.identifier->val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}